

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

C __thiscall dg::vr::ValueRelations::getAnyConst(ValueRelations *this,Handle h)

{
  C pCVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  key_type local_8;
  
  local_8._M_data = h;
  cVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&(this->bucketToVals)._M_t,&local_8);
  p_Var3 = cVar2._M_node[1]._M_parent;
  do {
    if (p_Var3 == cVar2._M_node[1]._M_left) {
      return (C)0x0;
    }
    pCVar1 = *(C *)p_Var3;
    p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
  } while ((pCVar1 == (C)0x0) || (pCVar1[0x10] != (ConstantInt)0x10));
  return pCVar1;
}

Assistant:

ValueRelations::C ValueRelations::getAnyConst(Handle h) const {
    for (V val : bucketToVals.find(h)->second) {
        if (C c = llvm::dyn_cast<BareC>(val))
            return c;
    }
    return nullptr;
}